

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O1

ON_Object * __thiscall ON_HatchPattern::Internal_DeepCopy(ON_HatchPattern *this)

{
  ON_HatchPattern *this_00;
  
  this_00 = (ON_HatchPattern *)operator_new(0xb8);
  ON_HatchPattern(this_00,this);
  return (ON_Object *)this_00;
}

Assistant:

ON_HatchPattern::HatchFillType ON_HatchPattern::HatchFillTypeFromUnsigned(
  unsigned hatch_fill_type_as_unsigned
  )
{
  switch (hatch_fill_type_as_unsigned)
  {
    ON_ENUM_FROM_UNSIGNED_CASE(ON_HatchPattern::HatchFillType::Solid);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_HatchPattern::HatchFillType::Lines);
    //ON_ENUM_FROM_UNSIGNED_CASE(ON_HatchPattern::HatchFillType::Gradient);
  }
  ON_ERROR("Invalid hatch_fill_type_as_unsigned value.");
  return ON_HatchPattern::HatchFillType::Solid;
}